

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

uint32_t helper_recpe_u32_aarch64(uint32_t a,void *fpstp)

{
  int iVar1;
  
  if (-1 < (int)a) {
    return 0xffffffff;
  }
  iVar1 = recip_estimate(a >> 0x17);
  return iVar1 << 0x17;
}

Assistant:

uint32_t HELPER(recpe_u32)(uint32_t a, void *fpstp)
{
    /* float_status *s = fpstp; */
    int input, estimate;

    if ((a & 0x80000000) == 0) {
        return 0xffffffff;
    }

    input = extract32(a, 23, 9);
    estimate = recip_estimate(input);

    return deposit32(0, (32 - 9), 9, estimate);
}